

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O2

void VP8LPutBitsFlushBits(VP8LBitWriter *bw)

{
  ulong uVar1;
  int iVar2;
  uint8_t *puVar3;
  
  puVar3 = bw->cur_;
  if (bw->end_ < puVar3 + 4) {
    iVar2 = VP8LBitWriterResize(bw,(size_t)(bw->end_ + (0x8000 - (long)bw->buf_)));
    if (iVar2 == 0) {
      bw->cur_ = bw->buf_;
      bw->error_ = 1;
      return;
    }
    puVar3 = bw->cur_;
  }
  uVar1 = bw->bits_;
  *(int *)puVar3 = (int)uVar1;
  bw->cur_ = puVar3 + 4;
  bw->bits_ = uVar1 >> 0x20;
  bw->used_ = bw->used_ + -0x20;
  return;
}

Assistant:

void VP8LPutBitsFlushBits(VP8LBitWriter* const bw) {
  // If needed, make some room by flushing some bits out.
  if (bw->cur_ + VP8L_WRITER_BYTES > bw->end_) {
    const uint64_t extra_size = (bw->end_ - bw->buf_) + MIN_EXTRA_SIZE;
    if (!CheckSizeOverflow(extra_size) ||
        !VP8LBitWriterResize(bw, (size_t)extra_size)) {
      bw->cur_ = bw->buf_;
      bw->error_ = 1;
      return;
    }
  }
  *(vp8l_wtype_t*)bw->cur_ = (vp8l_wtype_t)WSWAP((vp8l_wtype_t)bw->bits_);
  bw->cur_ += VP8L_WRITER_BYTES;
  bw->bits_ >>= VP8L_WRITER_BITS;
  bw->used_ -= VP8L_WRITER_BITS;
}